

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_intra_pred_luma_planar_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  UWORD8 UVar5;
  UWORD8 UVar6;
  UWORD8 UVar7;
  UWORD8 UVar8;
  UWORD8 UVar9;
  UWORD8 UVar10;
  UWORD8 UVar11;
  UWORD8 UVar12;
  long lVar13;
  UWORD8 *pUVar14;
  ulong uVar15;
  uint uVar16;
  byte *pbVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar47 [16];
  undefined1 auVar55 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  ushort uVar77;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ushort uVar88;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ushort uVar89;
  short sVar90;
  ushort uVar93;
  short sVar94;
  ushort uVar95;
  short sVar96;
  ushort uVar97;
  short sVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  undefined1 in_XMM9 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  ushort uVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  ushort uVar106;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  undefined1 auVar107 [16];
  ushort uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  ushort uVar147;
  ushort uVar160;
  ushort uVar161;
  ushort uVar162;
  ushort uVar163;
  ushort uVar164;
  ushort uVar165;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  ushort uVar166;
  undefined1 auVar159 [16];
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 auVar56 [16];
  undefined1 auVar41 [16];
  undefined1 auVar49 [16];
  undefined1 auVar57 [16];
  undefined1 auVar42 [16];
  undefined1 auVar50 [16];
  undefined1 auVar58 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  undefined1 auVar45 [16];
  undefined1 auVar53 [16];
  undefined1 auVar61 [16];
  undefined1 auVar46 [16];
  undefined1 auVar54 [16];
  undefined1 auVar62 [16];
  short sVar63;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  undefined1 auVar117 [16];
  undefined1 auVar126 [16];
  undefined1 auVar118 [16];
  undefined1 auVar127 [16];
  undefined1 auVar119 [16];
  undefined1 auVar128 [16];
  undefined1 auVar120 [16];
  undefined1 auVar129 [16];
  undefined1 auVar121 [16];
  undefined1 auVar130 [16];
  undefined1 auVar122 [16];
  undefined1 auVar131 [16];
  undefined1 auVar123 [16];
  undefined1 auVar132 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  
  uVar4 = nt * 2;
  bVar2 = pu1_ref[(long)nt + -1];
  bVar3 = pu1_ref[(long)nt * 3 + 1];
  auVar22 = ZEXT216(CONCAT11(bVar2,bVar3));
  auVar22 = pshuflw(auVar22,auVar22,0);
  uVar21 = auVar22._0_4_;
  auVar31._4_4_ = uVar21;
  auVar31._0_4_ = uVar21;
  auVar31._8_4_ = uVar21;
  auVar31._12_4_ = uVar21;
  auVar22 = pshuflw(ZEXT416((uint)nt),ZEXT416((uint)nt),0);
  uVar21 = auVar22._0_4_;
  auVar115._4_4_ = uVar21;
  auVar115._0_4_ = uVar21;
  auVar115._8_4_ = uVar21;
  auVar115._12_4_ = uVar21;
  sVar90 = auVar22._0_2_;
  sVar94 = auVar22._2_2_;
  if (nt == 0x20) {
    pUVar14 = pu1_dst + 0x10;
    lVar13 = 0x20;
    auVar115 = pmovsxbw(in_XMM9,0x1818181818181818);
    auVar22 = _DAT_001720b0;
    auVar135 = _DAT_001721a0;
    do {
      auVar133 = pshufb(ZEXT116(pu1_ref[lVar13 + (long)(int)uVar4 + -0x21]),_DAT_001714d0);
      sVar96 = auVar135._0_2_;
      auVar148._0_2_ = sVar96 + -8;
      sVar98 = auVar135._2_2_;
      auVar148._2_2_ = sVar98 + -8;
      sVar25 = auVar135._4_2_;
      auVar148._4_2_ = sVar25 + -8;
      sVar26 = auVar135._6_2_;
      auVar148._6_2_ = sVar26 + -8;
      sVar27 = auVar135._8_2_;
      auVar148._8_2_ = sVar27 + -8;
      sVar28 = auVar135._10_2_;
      auVar148._10_2_ = sVar28 + -8;
      sVar29 = auVar135._12_2_;
      sVar30 = auVar135._14_2_;
      auVar148._12_2_ = sVar29 + -8;
      auVar148._14_2_ = sVar30 + -8;
      sVar63 = auVar22._0_2_;
      auVar146._0_2_ = sVar63 + 8;
      sVar68 = auVar22._2_2_;
      auVar146._2_2_ = sVar68 + 8;
      sVar69 = auVar22._4_2_;
      auVar146._4_2_ = sVar69 + 8;
      sVar70 = auVar22._6_2_;
      auVar146._6_2_ = sVar70 + 8;
      sVar71 = auVar22._8_2_;
      auVar146._8_2_ = sVar71 + 8;
      sVar72 = auVar22._10_2_;
      auVar146._10_2_ = sVar72 + 8;
      sVar73 = auVar22._12_2_;
      sVar74 = auVar22._14_2_;
      auVar146._12_2_ = sVar73 + 8;
      auVar146._14_2_ = sVar74 + 8;
      auVar103._0_2_ = sVar96 + -0x10;
      auVar103._2_2_ = sVar98 + -0x10;
      auVar103._4_2_ = sVar25 + -0x10;
      auVar103._6_2_ = sVar26 + -0x10;
      auVar103._8_2_ = sVar27 + -0x10;
      auVar103._10_2_ = sVar28 + -0x10;
      auVar103._12_2_ = sVar29 + -0x10;
      auVar103._14_2_ = sVar30 + -0x10;
      auVar67._0_2_ = sVar63 + 0x10;
      auVar67._2_2_ = sVar68 + 0x10;
      auVar67._4_2_ = sVar69 + 0x10;
      auVar67._6_2_ = sVar70 + 0x10;
      auVar67._8_2_ = sVar71 + 0x10;
      auVar67._10_2_ = sVar72 + 0x10;
      auVar67._12_2_ = sVar73 + 0x10;
      auVar67._14_2_ = sVar74 + 0x10;
      pUVar1 = pu1_ref + (ulong)uVar4 + 1;
      auVar62._0_14_ = auVar133._0_14_;
      auVar62[0xe] = auVar133[7];
      auVar62[0xf] = pUVar1[7];
      auVar61._14_2_ = auVar62._14_2_;
      auVar61._0_13_ = auVar133._0_13_;
      auVar61[0xd] = pUVar1[6];
      auVar60._13_3_ = auVar61._13_3_;
      auVar60._0_12_ = auVar133._0_12_;
      auVar60[0xc] = auVar133[6];
      auVar59._12_4_ = auVar60._12_4_;
      auVar59._0_11_ = auVar133._0_11_;
      auVar59[0xb] = pUVar1[5];
      auVar58._11_5_ = auVar59._11_5_;
      auVar58._0_10_ = auVar133._0_10_;
      auVar58[10] = auVar133[5];
      auVar57._10_6_ = auVar58._10_6_;
      auVar57._0_9_ = auVar133._0_9_;
      auVar57[9] = pUVar1[4];
      auVar56._9_7_ = auVar57._9_7_;
      auVar56._0_8_ = auVar133._0_8_;
      auVar56[8] = auVar133[4];
      auVar55._8_8_ = auVar56._8_8_;
      auVar55[7] = pUVar1[3];
      auVar55[6] = auVar133[3];
      auVar55[5] = pUVar1[2];
      auVar55[4] = auVar133[2];
      auVar55[3] = pUVar1[1];
      auVar55[2] = auVar133[1];
      auVar55[0] = auVar133[0];
      auVar55[1] = *pUVar1;
      auVar159[1] = pUVar1[8];
      auVar159[0] = auVar133[8];
      auVar159[2] = auVar133[9];
      auVar159[3] = pUVar1[9];
      auVar159[4] = auVar133[10];
      auVar159[5] = pUVar1[10];
      auVar159[6] = auVar133[0xb];
      auVar159[7] = pUVar1[0xb];
      auVar159[8] = auVar133[0xc];
      auVar159[9] = pUVar1[0xc];
      auVar159[10] = auVar133[0xd];
      auVar159[0xb] = pUVar1[0xd];
      auVar159[0xc] = auVar133[0xe];
      auVar159[0xd] = pUVar1[0xe];
      auVar159[0xe] = auVar133[0xf];
      auVar159[0xf] = pUVar1[0xf];
      pUVar1 = pu1_ref + (ulong)uVar4 + 0x11;
      auVar159 = pmaddubsw(auVar159,auVar148);
      auVar79[0xe] = auVar133[7];
      auVar79._0_14_ = auVar62._0_14_;
      auVar79[0xf] = pUVar1[7];
      auVar124._14_2_ = auVar79._14_2_;
      auVar124[0xd] = pUVar1[6];
      auVar124._0_13_ = auVar61._0_13_;
      auVar144._13_3_ = auVar124._13_3_;
      auVar144[0xc] = auVar133[6];
      auVar144._0_12_ = auVar60._0_12_;
      auVar157._12_4_ = auVar144._12_4_;
      auVar157[0xb] = pUVar1[5];
      auVar157._0_11_ = auVar59._0_11_;
      auVar105._11_5_ = auVar157._11_5_;
      auVar105[10] = auVar133[5];
      auVar105._0_10_ = auVar58._0_10_;
      auVar38._10_6_ = auVar105._10_6_;
      auVar38[9] = pUVar1[4];
      auVar38._0_9_ = auVar57._0_9_;
      auVar37._9_7_ = auVar38._9_7_;
      auVar37[8] = auVar133[4];
      auVar37._0_8_ = auVar56._0_8_;
      auVar36._8_8_ = auVar37._8_8_;
      auVar36[7] = pUVar1[3];
      auVar36[6] = auVar133[3];
      auVar36[5] = pUVar1[2];
      auVar36[4] = auVar133[2];
      auVar36[3] = pUVar1[1];
      auVar36[2] = auVar133[1];
      auVar36[1] = *pUVar1;
      auVar36[0] = auVar55[0];
      auVar148 = pmaddubsw(auVar36,auVar103);
      auVar104._0_2_ = sVar96 + -0x18;
      auVar104._2_2_ = sVar98 + -0x18;
      auVar104._4_2_ = sVar25 + -0x18;
      auVar104._6_2_ = sVar26 + -0x18;
      auVar104._8_2_ = sVar27 + -0x18;
      auVar104._10_2_ = sVar28 + -0x18;
      auVar104._12_2_ = sVar29 + -0x18;
      auVar104._14_2_ = sVar30 + -0x18;
      auVar134[1] = pUVar1[8];
      auVar134[0] = auVar133[8];
      auVar134[2] = auVar133[9];
      auVar134[3] = pUVar1[9];
      auVar134[4] = auVar133[10];
      auVar134[5] = pUVar1[10];
      auVar134[6] = auVar133[0xb];
      auVar134[7] = pUVar1[0xb];
      auVar134[8] = auVar133[0xc];
      auVar134[9] = pUVar1[0xc];
      auVar134[10] = auVar133[0xd];
      auVar134[0xb] = pUVar1[0xd];
      auVar134[0xc] = auVar133[0xe];
      auVar134[0xd] = pUVar1[0xe];
      auVar134[0xe] = auVar133[0xf];
      auVar134[0xf] = pUVar1[0xf];
      auVar133._0_2_ = sVar63 + auVar115._0_2_;
      auVar133._2_2_ = sVar68 + auVar115._2_2_;
      auVar133._4_2_ = sVar69 + auVar115._4_2_;
      auVar133._6_2_ = sVar70 + auVar115._6_2_;
      auVar133._8_2_ = sVar71 + auVar115._8_2_;
      auVar133._10_2_ = sVar72 + auVar115._10_2_;
      auVar133._12_2_ = sVar73 + auVar115._12_2_;
      auVar133._14_2_ = sVar74 + auVar115._14_2_;
      auVar157 = pmaddubsw(auVar134,auVar104);
      auVar144 = pmaddubsw(auVar31,auVar146);
      auVar105 = pmaddubsw(auVar31,auVar67);
      auVar124 = pmaddubsw(auVar31,auVar133);
      auVar79 = pmaddubsw(auVar31,auVar22);
      auVar22 = pmaddubsw(auVar55,auVar135);
      uVar77 = (ushort)(auVar79._0_2_ + sVar90 + auVar22._0_2_) >> 6;
      uVar82 = (ushort)(auVar79._2_2_ + sVar94 + auVar22._2_2_) >> 6;
      uVar83 = (ushort)(auVar79._4_2_ + sVar90 + auVar22._4_2_) >> 6;
      uVar84 = (ushort)(auVar79._6_2_ + sVar94 + auVar22._6_2_) >> 6;
      uVar85 = (ushort)(auVar79._8_2_ + sVar90 + auVar22._8_2_) >> 6;
      uVar86 = (ushort)(auVar79._10_2_ + sVar94 + auVar22._10_2_) >> 6;
      uVar87 = (ushort)(auVar79._12_2_ + sVar90 + auVar22._12_2_) >> 6;
      uVar88 = (ushort)(auVar79._14_2_ + sVar94 + auVar22._14_2_) >> 6;
      uVar106 = (ushort)(auVar144._0_2_ + sVar90 + auVar159._0_2_) >> 6;
      uVar108 = (ushort)(auVar144._2_2_ + sVar94 + auVar159._2_2_) >> 6;
      uVar109 = (ushort)(auVar144._4_2_ + sVar90 + auVar159._4_2_) >> 6;
      uVar110 = (ushort)(auVar144._6_2_ + sVar94 + auVar159._6_2_) >> 6;
      uVar111 = (ushort)(auVar144._8_2_ + sVar90 + auVar159._8_2_) >> 6;
      uVar112 = (ushort)(auVar144._10_2_ + sVar94 + auVar159._10_2_) >> 6;
      uVar113 = (ushort)(auVar144._12_2_ + sVar90 + auVar159._12_2_) >> 6;
      uVar114 = (ushort)(auVar144._14_2_ + sVar94 + auVar159._14_2_) >> 6;
      uVar147 = (ushort)(auVar105._0_2_ + sVar90 + auVar148._0_2_) >> 6;
      uVar160 = (ushort)(auVar105._2_2_ + sVar94 + auVar148._2_2_) >> 6;
      uVar161 = (ushort)(auVar105._4_2_ + sVar90 + auVar148._4_2_) >> 6;
      uVar162 = (ushort)(auVar105._6_2_ + sVar94 + auVar148._6_2_) >> 6;
      uVar163 = (ushort)(auVar105._8_2_ + sVar90 + auVar148._8_2_) >> 6;
      uVar164 = (ushort)(auVar105._10_2_ + sVar94 + auVar148._10_2_) >> 6;
      uVar165 = (ushort)(auVar105._12_2_ + sVar90 + auVar148._12_2_) >> 6;
      uVar166 = (ushort)(auVar105._14_2_ + sVar94 + auVar148._14_2_) >> 6;
      uVar89 = (ushort)(auVar124._0_2_ + sVar90 + auVar157._0_2_) >> 6;
      uVar93 = (ushort)(auVar124._2_2_ + sVar94 + auVar157._2_2_) >> 6;
      uVar95 = (ushort)(auVar124._4_2_ + sVar90 + auVar157._4_2_) >> 6;
      uVar97 = (ushort)(auVar124._6_2_ + sVar94 + auVar157._6_2_) >> 6;
      uVar99 = (ushort)(auVar124._8_2_ + sVar90 + auVar157._8_2_) >> 6;
      uVar100 = (ushort)(auVar124._10_2_ + sVar94 + auVar157._10_2_) >> 6;
      uVar101 = (ushort)(auVar124._12_2_ + sVar90 + auVar157._12_2_) >> 6;
      uVar102 = (ushort)(auVar124._14_2_ + sVar94 + auVar157._14_2_) >> 6;
      pUVar14[-0x10] = (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77);
      pUVar14[-0xf] = (uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82);
      pUVar14[-0xe] = (uVar83 != 0) * (uVar83 < 0x100) * (char)uVar83 - (0xff < uVar83);
      pUVar14[-0xd] = (uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84);
      pUVar14[-0xc] = (uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 - (0xff < uVar85);
      pUVar14[-0xb] = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
      pUVar14[-10] = (uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87);
      pUVar14[-9] = (uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88);
      pUVar14[-8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
      pUVar14[-7] = (uVar108 != 0) * (uVar108 < 0x100) * (char)uVar108 - (0xff < uVar108);
      pUVar14[-6] = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
      pUVar14[-5] = (uVar110 != 0) * (uVar110 < 0x100) * (char)uVar110 - (0xff < uVar110);
      pUVar14[-4] = (uVar111 != 0) * (uVar111 < 0x100) * (char)uVar111 - (0xff < uVar111);
      pUVar14[-3] = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
      pUVar14[-2] = (uVar113 != 0) * (uVar113 < 0x100) * (char)uVar113 - (0xff < uVar113);
      pUVar14[-1] = (uVar114 != 0) * (uVar114 < 0x100) * (char)uVar114 - (0xff < uVar114);
      *pUVar14 = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar147 - (0xff < uVar147);
      pUVar14[1] = (uVar160 != 0) * (uVar160 < 0x100) * (char)uVar160 - (0xff < uVar160);
      pUVar14[2] = (uVar161 != 0) * (uVar161 < 0x100) * (char)uVar161 - (0xff < uVar161);
      pUVar14[3] = (uVar162 != 0) * (uVar162 < 0x100) * (char)uVar162 - (0xff < uVar162);
      pUVar14[4] = (uVar163 != 0) * (uVar163 < 0x100) * (char)uVar163 - (0xff < uVar163);
      pUVar14[5] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
      pUVar14[6] = (uVar165 != 0) * (uVar165 < 0x100) * (char)uVar165 - (0xff < uVar165);
      pUVar14[7] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
      pUVar14[8] = (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89);
      pUVar14[9] = (uVar93 != 0) * (uVar93 < 0x100) * (char)uVar93 - (0xff < uVar93);
      pUVar14[10] = (uVar95 != 0) * (uVar95 < 0x100) * (char)uVar95 - (0xff < uVar95);
      pUVar14[0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
      pUVar14[0xc] = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
      pUVar14[0xd] = (uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 - (0xff < uVar100);
      pUVar14[0xe] = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
      pUVar14[0xf] = (uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 - (0xff < uVar102);
      auVar135._0_2_ = sVar96 + -0x100;
      auVar135._2_2_ = sVar98 + -0x100;
      auVar135._4_2_ = sVar25 + -0x100;
      auVar135._6_2_ = sVar26 + -0x100;
      auVar135._8_2_ = sVar27 + -0x100;
      auVar135._10_2_ = sVar28 + -0x100;
      auVar135._12_2_ = sVar29 + -0x100;
      auVar135._14_2_ = sVar30 + -0x100;
      auVar22._0_2_ = sVar63 + 0x100;
      auVar22._2_2_ = sVar68 + 0x100;
      auVar22._4_2_ = sVar69 + 0x100;
      auVar22._6_2_ = sVar70 + 0x100;
      auVar22._8_2_ = sVar71 + 0x100;
      auVar22._10_2_ = sVar72 + 0x100;
      auVar22._12_2_ = sVar73 + 0x100;
      auVar22._14_2_ = sVar74 + 0x100;
      pUVar14 = pUVar14 + dst_strd;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  else if (nt == 0x10) {
    uVar20 = (ulong)uVar4;
    pbVar17 = pu1_ref + (long)(int)uVar4 + -1;
    uVar15 = 0xfffffffffffffffe;
    auVar35 = _DAT_00172150;
    auVar76 = _DAT_001720b0;
    do {
      uVar4 = uVar4 - 2;
      auVar22 = pshufb(ZEXT116(*pbVar17),(undefined1  [16])0x0);
      auVar148 = pshufb(ZEXT116(pu1_ref[uVar4]),(undefined1  [16])0x0);
      sVar63 = auVar35._0_2_;
      auVar91._0_2_ = sVar63 + -0x100;
      sVar68 = auVar35._2_2_;
      auVar91._2_2_ = sVar68 + -0x100;
      sVar69 = auVar35._4_2_;
      auVar91._4_2_ = sVar69 + -0x100;
      sVar70 = auVar35._6_2_;
      auVar91._6_2_ = sVar70 + -0x100;
      sVar71 = auVar35._8_2_;
      auVar91._8_2_ = sVar71 + -0x100;
      sVar72 = auVar35._10_2_;
      auVar91._10_2_ = sVar72 + -0x100;
      sVar73 = auVar35._12_2_;
      sVar74 = auVar35._14_2_;
      auVar91._12_2_ = sVar73 + -0x100;
      auVar91._14_2_ = sVar74 + -0x100;
      sVar96 = auVar76._0_2_;
      auVar33._0_2_ = sVar96 + 0x100;
      sVar98 = auVar76._2_2_;
      auVar33._2_2_ = sVar98 + 0x100;
      sVar25 = auVar76._4_2_;
      auVar33._4_2_ = sVar25 + 0x100;
      sVar26 = auVar76._6_2_;
      auVar33._6_2_ = sVar26 + 0x100;
      sVar27 = auVar76._8_2_;
      auVar33._8_2_ = sVar27 + 0x100;
      sVar28 = auVar76._10_2_;
      auVar33._10_2_ = sVar28 + 0x100;
      sVar29 = auVar76._12_2_;
      sVar30 = auVar76._14_2_;
      auVar33._12_2_ = sVar29 + 0x100;
      auVar33._14_2_ = sVar30 + 0x100;
      auVar158._0_2_ = sVar63 + -8;
      auVar158._2_2_ = sVar68 + -8;
      auVar158._4_2_ = sVar69 + -8;
      auVar158._6_2_ = sVar70 + -8;
      auVar158._8_2_ = sVar71 + -8;
      auVar158._10_2_ = sVar72 + -8;
      auVar158._12_2_ = sVar73 + -8;
      auVar158._14_2_ = sVar74 + -8;
      auVar24._0_2_ = sVar96 + 8;
      auVar24._2_2_ = sVar98 + 8;
      auVar24._4_2_ = sVar25 + 8;
      auVar24._6_2_ = sVar26 + 8;
      auVar24._8_2_ = sVar27 + 8;
      auVar24._10_2_ = sVar28 + 8;
      auVar24._12_2_ = sVar29 + 8;
      auVar24._14_2_ = sVar30 + 8;
      pUVar14 = pu1_ref + uVar20 + 1;
      auVar54._0_14_ = auVar148._0_14_;
      auVar54[0xe] = auVar148[7];
      auVar54[0xf] = pUVar14[7];
      auVar53._14_2_ = auVar54._14_2_;
      auVar53._0_13_ = auVar148._0_13_;
      auVar53[0xd] = pUVar14[6];
      auVar52._13_3_ = auVar53._13_3_;
      auVar52._0_12_ = auVar148._0_12_;
      auVar52[0xc] = auVar148[6];
      auVar51._12_4_ = auVar52._12_4_;
      auVar51._0_11_ = auVar148._0_11_;
      auVar51[0xb] = pUVar14[5];
      auVar50._11_5_ = auVar51._11_5_;
      auVar50._0_10_ = auVar148._0_10_;
      auVar50[10] = auVar148[5];
      auVar49._10_6_ = auVar50._10_6_;
      auVar49._0_9_ = auVar148._0_9_;
      auVar49[9] = pUVar14[4];
      auVar48._9_7_ = auVar49._9_7_;
      auVar48._0_8_ = auVar148._0_8_;
      auVar48[8] = auVar148[4];
      auVar47._8_8_ = auVar48._8_8_;
      auVar47[7] = pUVar14[3];
      auVar47[6] = auVar148[3];
      auVar47[5] = pUVar14[2];
      auVar47[4] = auVar148[2];
      auVar47[3] = pUVar14[1];
      auVar47[2] = auVar148[1];
      auVar47[0] = auVar148[0];
      auVar47[1] = *pUVar14;
      auVar115 = pmaddubsw(auVar47,auVar91);
      auVar66[1] = pUVar14[8];
      auVar66[0] = auVar22[8];
      auVar66[2] = auVar22[9];
      auVar66[3] = pUVar14[9];
      auVar66[4] = auVar22[10];
      auVar66[5] = pUVar14[10];
      auVar66[6] = auVar22[0xb];
      auVar66[7] = pUVar14[0xb];
      auVar66[8] = auVar22[0xc];
      auVar66[9] = pUVar14[0xc];
      auVar66[10] = auVar22[0xd];
      auVar66[0xb] = pUVar14[0xd];
      auVar66[0xc] = auVar22[0xe];
      auVar66[0xd] = pUVar14[0xe];
      auVar66[0xe] = auVar22[0xf];
      auVar66[0xf] = pUVar14[0xf];
      auVar135 = pmaddubsw(auVar66,auVar158);
      auVar92._0_2_ = sVar63 + -0x108;
      auVar92._2_2_ = sVar68 + -0x108;
      auVar92._4_2_ = sVar69 + -0x108;
      auVar92._6_2_ = sVar70 + -0x108;
      auVar92._8_2_ = sVar71 + -0x108;
      auVar92._10_2_ = sVar72 + -0x108;
      auVar92._12_2_ = sVar73 + -0x108;
      auVar92._14_2_ = sVar74 + -0x108;
      auVar132._0_14_ = auVar22._0_14_;
      auVar132[0xe] = auVar22[7];
      auVar132[0xf] = pUVar14[7];
      auVar131._14_2_ = auVar132._14_2_;
      auVar131._0_13_ = auVar22._0_13_;
      auVar131[0xd] = pUVar14[6];
      auVar130._13_3_ = auVar131._13_3_;
      auVar130._0_12_ = auVar22._0_12_;
      auVar130[0xc] = auVar22[6];
      auVar129._12_4_ = auVar130._12_4_;
      auVar129._0_11_ = auVar22._0_11_;
      auVar129[0xb] = pUVar14[5];
      auVar128._11_5_ = auVar129._11_5_;
      auVar128._0_10_ = auVar22._0_10_;
      auVar128[10] = auVar22[5];
      auVar127._10_6_ = auVar128._10_6_;
      auVar127._0_9_ = auVar22._0_9_;
      auVar127[9] = pUVar14[4];
      auVar126._9_7_ = auVar127._9_7_;
      auVar126._0_8_ = auVar22._0_8_;
      auVar126[8] = auVar22[4];
      auVar125._8_8_ = auVar126._8_8_;
      auVar125[7] = pUVar14[3];
      auVar125[6] = auVar22[3];
      auVar125[5] = pUVar14[2];
      auVar125[4] = auVar22[2];
      auVar125[3] = pUVar14[1];
      auVar125[2] = auVar22[1];
      auVar125[0] = auVar22[0];
      auVar125[1] = *pUVar14;
      auVar145[1] = pUVar14[8];
      auVar145[0] = auVar148[8];
      auVar145[2] = auVar148[9];
      auVar145[3] = pUVar14[9];
      auVar145[4] = auVar148[10];
      auVar145[5] = pUVar14[10];
      auVar145[6] = auVar148[0xb];
      auVar145[7] = pUVar14[0xb];
      auVar145[8] = auVar148[0xc];
      auVar145[9] = pUVar14[0xc];
      auVar145[10] = auVar148[0xd];
      auVar145[0xb] = pUVar14[0xd];
      auVar145[0xc] = auVar148[0xe];
      auVar145[0xd] = pUVar14[0xe];
      auVar145[0xe] = auVar148[0xf];
      auVar145[0xf] = pUVar14[0xf];
      auVar80._0_2_ = sVar96 + 0x108;
      auVar80._2_2_ = sVar98 + 0x108;
      auVar80._4_2_ = sVar25 + 0x108;
      auVar80._6_2_ = sVar26 + 0x108;
      auVar80._8_2_ = sVar27 + 0x108;
      auVar80._10_2_ = sVar28 + 0x108;
      auVar80._12_2_ = sVar29 + 0x108;
      auVar80._14_2_ = sVar30 + 0x108;
      auVar144 = pmaddubsw(auVar145,auVar92);
      auVar157 = pmaddubsw(auVar31,auVar33);
      auVar79 = pmaddubsw(auVar31,auVar24);
      auVar22 = pmaddubsw(auVar31,auVar80);
      auVar148 = pmaddubsw(auVar31,auVar76);
      auVar124 = pmaddubsw(auVar125,auVar35);
      uVar89 = (ushort)(auVar148._0_2_ + sVar90 + auVar124._0_2_) >> 5;
      uVar93 = (ushort)(auVar148._2_2_ + sVar94 + auVar124._2_2_) >> 5;
      uVar95 = (ushort)(auVar148._4_2_ + sVar90 + auVar124._4_2_) >> 5;
      uVar97 = (ushort)(auVar148._6_2_ + sVar94 + auVar124._6_2_) >> 5;
      uVar99 = (ushort)(auVar148._8_2_ + sVar90 + auVar124._8_2_) >> 5;
      uVar100 = (ushort)(auVar148._10_2_ + sVar94 + auVar124._10_2_) >> 5;
      uVar101 = (ushort)(auVar148._12_2_ + sVar90 + auVar124._12_2_) >> 5;
      uVar102 = (ushort)(auVar148._14_2_ + sVar94 + auVar124._14_2_) >> 5;
      uVar106 = (ushort)(auVar79._0_2_ + sVar90 + auVar135._0_2_) >> 5;
      uVar108 = (ushort)(auVar79._2_2_ + sVar94 + auVar135._2_2_) >> 5;
      uVar109 = (ushort)(auVar79._4_2_ + sVar90 + auVar135._4_2_) >> 5;
      uVar110 = (ushort)(auVar79._6_2_ + sVar94 + auVar135._6_2_) >> 5;
      uVar111 = (ushort)(auVar79._8_2_ + sVar90 + auVar135._8_2_) >> 5;
      uVar112 = (ushort)(auVar79._10_2_ + sVar94 + auVar135._10_2_) >> 5;
      uVar113 = (ushort)(auVar79._12_2_ + sVar90 + auVar135._12_2_) >> 5;
      uVar114 = (ushort)(auVar79._14_2_ + sVar94 + auVar135._14_2_) >> 5;
      uVar147 = (ushort)(auVar157._0_2_ + sVar90 + auVar115._0_2_) >> 5;
      uVar160 = (ushort)(auVar157._2_2_ + sVar94 + auVar115._2_2_) >> 5;
      uVar161 = (ushort)(auVar157._4_2_ + sVar90 + auVar115._4_2_) >> 5;
      uVar162 = (ushort)(auVar157._6_2_ + sVar94 + auVar115._6_2_) >> 5;
      uVar163 = (ushort)(auVar157._8_2_ + sVar90 + auVar115._8_2_) >> 5;
      uVar164 = (ushort)(auVar157._10_2_ + sVar94 + auVar115._10_2_) >> 5;
      uVar165 = (ushort)(auVar157._12_2_ + sVar90 + auVar115._12_2_) >> 5;
      uVar166 = (ushort)(auVar157._14_2_ + sVar94 + auVar115._14_2_) >> 5;
      uVar77 = (ushort)(auVar22._0_2_ + sVar90 + auVar144._0_2_) >> 5;
      uVar82 = (ushort)(auVar22._2_2_ + sVar94 + auVar144._2_2_) >> 5;
      uVar83 = (ushort)(auVar22._4_2_ + sVar90 + auVar144._4_2_) >> 5;
      uVar84 = (ushort)(auVar22._6_2_ + sVar94 + auVar144._6_2_) >> 5;
      uVar85 = (ushort)(auVar22._8_2_ + sVar90 + auVar144._8_2_) >> 5;
      uVar86 = (ushort)(auVar22._10_2_ + sVar94 + auVar144._10_2_) >> 5;
      uVar87 = (ushort)(auVar22._12_2_ + sVar90 + auVar144._12_2_) >> 5;
      uVar88 = (ushort)(auVar22._14_2_ + sVar94 + auVar144._14_2_) >> 5;
      *pu1_dst = (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89);
      pu1_dst[1] = (uVar93 != 0) * (uVar93 < 0x100) * (char)uVar93 - (0xff < uVar93);
      pu1_dst[2] = (uVar95 != 0) * (uVar95 < 0x100) * (char)uVar95 - (0xff < uVar95);
      pu1_dst[3] = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
      pu1_dst[4] = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
      pu1_dst[5] = (uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 - (0xff < uVar100);
      pu1_dst[6] = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
      pu1_dst[7] = (uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 - (0xff < uVar102);
      pu1_dst[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
      pu1_dst[9] = (uVar108 != 0) * (uVar108 < 0x100) * (char)uVar108 - (0xff < uVar108);
      pu1_dst[10] = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
      pu1_dst[0xb] = (uVar110 != 0) * (uVar110 < 0x100) * (char)uVar110 - (0xff < uVar110);
      pu1_dst[0xc] = (uVar111 != 0) * (uVar111 < 0x100) * (char)uVar111 - (0xff < uVar111);
      pu1_dst[0xd] = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
      pu1_dst[0xe] = (uVar113 != 0) * (uVar113 < 0x100) * (char)uVar113 - (0xff < uVar113);
      pu1_dst[0xf] = (uVar114 != 0) * (uVar114 < 0x100) * (char)uVar114 - (0xff < uVar114);
      pUVar14 = pu1_dst + dst_strd;
      *pUVar14 = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar147 - (0xff < uVar147);
      pUVar14[1] = (uVar160 != 0) * (uVar160 < 0x100) * (char)uVar160 - (0xff < uVar160);
      pUVar14[2] = (uVar161 != 0) * (uVar161 < 0x100) * (char)uVar161 - (0xff < uVar161);
      pUVar14[3] = (uVar162 != 0) * (uVar162 < 0x100) * (char)uVar162 - (0xff < uVar162);
      pUVar14[4] = (uVar163 != 0) * (uVar163 < 0x100) * (char)uVar163 - (0xff < uVar163);
      pUVar14[5] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
      pUVar14[6] = (uVar165 != 0) * (uVar165 < 0x100) * (char)uVar165 - (0xff < uVar165);
      pUVar14[7] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
      pUVar14[8] = (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77);
      pUVar14[9] = (uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82);
      pUVar14[10] = (uVar83 != 0) * (uVar83 < 0x100) * (char)uVar83 - (0xff < uVar83);
      pUVar14[0xb] = (uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84);
      pUVar14[0xc] = (uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 - (0xff < uVar85);
      pUVar14[0xd] = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
      pUVar14[0xe] = (uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87);
      pUVar14[0xf] = (uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88);
      auVar35._0_2_ = sVar63 + -0x200;
      auVar35._2_2_ = sVar68 + -0x200;
      auVar35._4_2_ = sVar69 + -0x200;
      auVar35._6_2_ = sVar70 + -0x200;
      auVar35._8_2_ = sVar71 + -0x200;
      auVar35._10_2_ = sVar72 + -0x200;
      auVar35._12_2_ = sVar73 + -0x200;
      auVar35._14_2_ = sVar74 + -0x200;
      auVar76._0_2_ = sVar96 + 0x200;
      auVar76._2_2_ = sVar98 + 0x200;
      auVar76._4_2_ = sVar25 + 0x200;
      auVar76._6_2_ = sVar26 + 0x200;
      auVar76._8_2_ = sVar27 + 0x200;
      auVar76._10_2_ = sVar28 + 0x200;
      auVar76._12_2_ = sVar29 + 0x200;
      auVar76._14_2_ = sVar30 + 0x200;
      uVar15 = uVar15 + 2;
      pu1_dst = pu1_dst + (long)dst_strd * 2;
      pbVar17 = pbVar17 + -2;
    } while (uVar15 < 0xe);
  }
  else if (nt == 8) {
    lVar13 = (long)dst_strd;
    uVar16 = uVar4 - 2;
    lVar19 = 4;
    auVar32 = _DAT_001720b0;
    auVar34 = _DAT_001720c0;
    do {
      auVar115 = pshufb(ZEXT116(pu1_ref[lVar19 + (long)(int)uVar4 + -5]),(undefined1  [16])0x0);
      auVar135 = pshufb(ZEXT116(pu1_ref[uVar16]),(undefined1  [16])0x0);
      auVar148 = pshufb(ZEXT116(pu1_ref[uVar16 - 1]),(undefined1  [16])0x0);
      auVar22 = pshufb(ZEXT116(pu1_ref[uVar16 - 2]),(undefined1  [16])0x0);
      sVar63 = auVar34._0_2_;
      auVar64._0_2_ = sVar63 + -0x100;
      sVar68 = auVar34._2_2_;
      auVar64._2_2_ = sVar68 + -0x100;
      sVar69 = auVar34._4_2_;
      auVar64._4_2_ = sVar69 + -0x100;
      sVar70 = auVar34._6_2_;
      auVar64._6_2_ = sVar70 + -0x100;
      sVar71 = auVar34._8_2_;
      auVar64._8_2_ = sVar71 + -0x100;
      sVar72 = auVar34._10_2_;
      auVar64._10_2_ = sVar72 + -0x100;
      sVar73 = auVar34._12_2_;
      sVar74 = auVar34._14_2_;
      auVar64._12_2_ = sVar73 + -0x100;
      auVar64._14_2_ = sVar74 + -0x100;
      sVar96 = auVar32._0_2_;
      auVar23._0_2_ = sVar96 + 0x100;
      sVar98 = auVar32._2_2_;
      auVar23._2_2_ = sVar98 + 0x100;
      sVar25 = auVar32._4_2_;
      auVar23._4_2_ = sVar25 + 0x100;
      sVar26 = auVar32._6_2_;
      auVar23._6_2_ = sVar26 + 0x100;
      sVar27 = auVar32._8_2_;
      auVar23._8_2_ = sVar27 + 0x100;
      sVar28 = auVar32._10_2_;
      auVar23._10_2_ = sVar28 + 0x100;
      sVar29 = auVar32._12_2_;
      sVar30 = auVar32._14_2_;
      auVar23._12_2_ = sVar29 + 0x100;
      auVar23._14_2_ = sVar30 + 0x100;
      auVar75._0_2_ = sVar63 + -0x200;
      auVar75._2_2_ = sVar68 + -0x200;
      auVar75._4_2_ = sVar69 + -0x200;
      auVar75._6_2_ = sVar70 + -0x200;
      auVar75._8_2_ = sVar71 + -0x200;
      auVar75._10_2_ = sVar72 + -0x200;
      auVar75._12_2_ = sVar73 + -0x200;
      auVar75._14_2_ = sVar74 + -0x200;
      pUVar14 = pu1_ref + (ulong)uVar4 + 1;
      UVar5 = *pUVar14;
      UVar6 = pUVar14[1];
      UVar7 = pUVar14[2];
      UVar8 = pUVar14[3];
      UVar9 = pUVar14[4];
      UVar10 = pUVar14[5];
      UVar11 = pUVar14[6];
      UVar12 = pUVar14[7];
      auVar143._0_14_ = auVar135._0_14_;
      auVar143[0xe] = auVar135[7];
      auVar143[0xf] = UVar12;
      auVar142._14_2_ = auVar143._14_2_;
      auVar142._0_13_ = auVar135._0_13_;
      auVar142[0xd] = UVar11;
      auVar141._13_3_ = auVar142._13_3_;
      auVar141._0_12_ = auVar135._0_12_;
      auVar141[0xc] = auVar135[6];
      auVar140._12_4_ = auVar141._12_4_;
      auVar140._0_11_ = auVar135._0_11_;
      auVar140[0xb] = UVar10;
      auVar139._11_5_ = auVar140._11_5_;
      auVar139._0_10_ = auVar135._0_10_;
      auVar139[10] = auVar135[5];
      auVar138._10_6_ = auVar139._10_6_;
      auVar138._0_9_ = auVar135._0_9_;
      auVar138[9] = UVar9;
      auVar137._9_7_ = auVar138._9_7_;
      auVar137._0_8_ = auVar135._0_8_;
      auVar137[8] = auVar135[4];
      auVar136._8_8_ = auVar137._8_8_;
      auVar136[7] = UVar8;
      auVar136[6] = auVar135[3];
      auVar136[5] = UVar7;
      auVar136[4] = auVar135[2];
      auVar136[3] = UVar6;
      auVar136[2] = auVar135[1];
      auVar136[0] = auVar135[0];
      auVar136[1] = UVar5;
      auVar144 = pmaddubsw(auVar136,auVar64);
      auVar107._0_2_ = sVar96 + 0x200;
      auVar107._2_2_ = sVar98 + 0x200;
      auVar107._4_2_ = sVar25 + 0x200;
      auVar107._6_2_ = sVar26 + 0x200;
      auVar107._8_2_ = sVar27 + 0x200;
      auVar107._10_2_ = sVar28 + 0x200;
      auVar107._12_2_ = sVar29 + 0x200;
      auVar107._14_2_ = sVar30 + 0x200;
      auVar156._0_14_ = auVar148._0_14_;
      auVar156[0xe] = auVar148[7];
      auVar156[0xf] = UVar12;
      auVar155._14_2_ = auVar156._14_2_;
      auVar155._0_13_ = auVar148._0_13_;
      auVar155[0xd] = UVar11;
      auVar154._13_3_ = auVar155._13_3_;
      auVar154._0_12_ = auVar148._0_12_;
      auVar154[0xc] = auVar148[6];
      auVar153._12_4_ = auVar154._12_4_;
      auVar153._0_11_ = auVar148._0_11_;
      auVar153[0xb] = UVar10;
      auVar152._11_5_ = auVar153._11_5_;
      auVar152._0_10_ = auVar148._0_10_;
      auVar152[10] = auVar148[5];
      auVar151._10_6_ = auVar152._10_6_;
      auVar151._0_9_ = auVar148._0_9_;
      auVar151[9] = UVar9;
      auVar150._9_7_ = auVar151._9_7_;
      auVar150._0_8_ = auVar148._0_8_;
      auVar150[8] = auVar148[4];
      auVar149._8_8_ = auVar150._8_8_;
      auVar149[7] = UVar8;
      auVar149[6] = auVar148[3];
      auVar149[5] = UVar7;
      auVar149[4] = auVar148[2];
      auVar149[3] = UVar6;
      auVar149[2] = auVar148[1];
      auVar149[0] = auVar148[0];
      auVar149[1] = UVar5;
      auVar157 = pmaddubsw(auVar149,auVar75);
      auVar65._0_2_ = sVar63 + -0x300;
      auVar65._2_2_ = sVar68 + -0x300;
      auVar65._4_2_ = sVar69 + -0x300;
      auVar65._6_2_ = sVar70 + -0x300;
      auVar65._8_2_ = sVar71 + -0x300;
      auVar65._10_2_ = sVar72 + -0x300;
      auVar65._12_2_ = sVar73 + -0x300;
      auVar65._14_2_ = sVar74 + -0x300;
      auVar123._0_14_ = auVar115._0_14_;
      auVar123[0xe] = auVar115[7];
      auVar123[0xf] = UVar12;
      auVar122._14_2_ = auVar123._14_2_;
      auVar122._0_13_ = auVar115._0_13_;
      auVar122[0xd] = UVar11;
      auVar121._13_3_ = auVar122._13_3_;
      auVar121._0_12_ = auVar115._0_12_;
      auVar121[0xc] = auVar115[6];
      auVar120._12_4_ = auVar121._12_4_;
      auVar120._0_11_ = auVar115._0_11_;
      auVar120[0xb] = UVar10;
      auVar119._11_5_ = auVar120._11_5_;
      auVar119._0_10_ = auVar115._0_10_;
      auVar119[10] = auVar115[5];
      auVar118._10_6_ = auVar119._10_6_;
      auVar118._0_9_ = auVar115._0_9_;
      auVar118[9] = UVar9;
      auVar117._9_7_ = auVar118._9_7_;
      auVar117._0_8_ = auVar115._0_8_;
      auVar117[8] = auVar115[4];
      auVar116._8_8_ = auVar117._8_8_;
      auVar116[7] = UVar8;
      auVar116[6] = auVar115[3];
      auVar116[5] = UVar7;
      auVar116[4] = auVar115[2];
      auVar116[3] = UVar6;
      auVar116[2] = auVar115[1];
      auVar116[0] = auVar115[0];
      auVar116[1] = UVar5;
      auVar46._0_14_ = auVar22._0_14_;
      auVar46[0xe] = auVar22[7];
      auVar46[0xf] = UVar12;
      auVar45._14_2_ = auVar46._14_2_;
      auVar45._0_13_ = auVar22._0_13_;
      auVar45[0xd] = UVar11;
      auVar44._13_3_ = auVar45._13_3_;
      auVar44._0_12_ = auVar22._0_12_;
      auVar44[0xc] = auVar22[6];
      auVar43._12_4_ = auVar44._12_4_;
      auVar43._0_11_ = auVar22._0_11_;
      auVar43[0xb] = UVar10;
      auVar42._11_5_ = auVar43._11_5_;
      auVar42._0_10_ = auVar22._0_10_;
      auVar42[10] = auVar22[5];
      auVar41._10_6_ = auVar42._10_6_;
      auVar41._0_9_ = auVar22._0_9_;
      auVar41[9] = UVar9;
      auVar40._9_7_ = auVar41._9_7_;
      auVar40._0_8_ = auVar22._0_8_;
      auVar40[8] = auVar22[4];
      auVar39._8_8_ = auVar40._8_8_;
      auVar39[7] = UVar8;
      auVar39[6] = auVar22[3];
      auVar39[5] = UVar7;
      auVar39[4] = auVar22[2];
      auVar39[3] = UVar6;
      auVar39[2] = auVar22[1];
      auVar39[0] = auVar22[0];
      auVar39[1] = UVar5;
      auVar78._0_2_ = sVar96 + 0x300;
      auVar78._2_2_ = sVar98 + 0x300;
      auVar78._4_2_ = sVar25 + 0x300;
      auVar78._6_2_ = sVar26 + 0x300;
      auVar78._8_2_ = sVar27 + 0x300;
      auVar78._10_2_ = sVar28 + 0x300;
      auVar78._12_2_ = sVar29 + 0x300;
      auVar78._14_2_ = sVar30 + 0x300;
      auVar115 = pmaddubsw(auVar39,auVar65);
      auVar148 = pmaddubsw(auVar31,auVar23);
      auVar135 = pmaddubsw(auVar31,auVar107);
      auVar22 = pmaddubsw(auVar31,auVar78);
      auVar79 = pmaddubsw(auVar31,auVar32);
      auVar124 = pmaddubsw(auVar116,auVar34);
      uVar77 = (ushort)(auVar79._0_2_ + sVar90 + auVar124._0_2_) >> 4;
      uVar82 = (ushort)(auVar79._2_2_ + sVar94 + auVar124._2_2_) >> 4;
      uVar83 = (ushort)(auVar79._4_2_ + sVar90 + auVar124._4_2_) >> 4;
      uVar84 = (ushort)(auVar79._6_2_ + sVar94 + auVar124._6_2_) >> 4;
      uVar85 = (ushort)(auVar79._8_2_ + sVar90 + auVar124._8_2_) >> 4;
      uVar86 = (ushort)(auVar79._10_2_ + sVar94 + auVar124._10_2_) >> 4;
      uVar87 = (ushort)(auVar79._12_2_ + sVar90 + auVar124._12_2_) >> 4;
      uVar88 = (ushort)(auVar79._14_2_ + sVar94 + auVar124._14_2_) >> 4;
      *(ulong *)pu1_dst =
           CONCAT17((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                    CONCAT16((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87),
                             CONCAT15((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                      (0xff < uVar86),
                                      CONCAT14((uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 -
                                               (0xff < uVar85),
                                               CONCAT13((uVar84 != 0) * (uVar84 < 0x100) *
                                                        (char)uVar84 - (0xff < uVar84),
                                                        CONCAT12((uVar83 != 0) * (uVar83 < 0x100) *
                                                                 (char)uVar83 - (0xff < uVar83),
                                                                 CONCAT11((uVar82 != 0) *
                                                                          (uVar82 < 0x100) *
                                                                          (char)uVar82 -
                                                                          (0xff < uVar82),
                                                                          (uVar77 != 0) *
                                                                          (uVar77 < 0x100) *
                                                                          (char)uVar77 -
                                                                          (0xff < uVar77))))))));
      uVar77 = (ushort)(auVar148._0_2_ + sVar90 + auVar144._0_2_) >> 4;
      uVar82 = (ushort)(auVar148._2_2_ + sVar94 + auVar144._2_2_) >> 4;
      uVar83 = (ushort)(auVar148._4_2_ + sVar90 + auVar144._4_2_) >> 4;
      uVar84 = (ushort)(auVar148._6_2_ + sVar94 + auVar144._6_2_) >> 4;
      uVar85 = (ushort)(auVar148._8_2_ + sVar90 + auVar144._8_2_) >> 4;
      uVar86 = (ushort)(auVar148._10_2_ + sVar94 + auVar144._10_2_) >> 4;
      uVar87 = (ushort)(auVar148._12_2_ + sVar90 + auVar144._12_2_) >> 4;
      uVar88 = (ushort)(auVar148._14_2_ + sVar94 + auVar144._14_2_) >> 4;
      *(ulong *)(pu1_dst + lVar13) =
           CONCAT17((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                    CONCAT16((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87),
                             CONCAT15((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                      (0xff < uVar86),
                                      CONCAT14((uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 -
                                               (0xff < uVar85),
                                               CONCAT13((uVar84 != 0) * (uVar84 < 0x100) *
                                                        (char)uVar84 - (0xff < uVar84),
                                                        CONCAT12((uVar83 != 0) * (uVar83 < 0x100) *
                                                                 (char)uVar83 - (0xff < uVar83),
                                                                 CONCAT11((uVar82 != 0) *
                                                                          (uVar82 < 0x100) *
                                                                          (char)uVar82 -
                                                                          (0xff < uVar82),
                                                                          (uVar77 != 0) *
                                                                          (uVar77 < 0x100) *
                                                                          (char)uVar77 -
                                                                          (0xff < uVar77))))))));
      uVar77 = (ushort)(auVar135._0_2_ + sVar90 + auVar157._0_2_) >> 4;
      uVar82 = (ushort)(auVar135._2_2_ + sVar94 + auVar157._2_2_) >> 4;
      uVar83 = (ushort)(auVar135._4_2_ + sVar90 + auVar157._4_2_) >> 4;
      uVar84 = (ushort)(auVar135._6_2_ + sVar94 + auVar157._6_2_) >> 4;
      uVar85 = (ushort)(auVar135._8_2_ + sVar90 + auVar157._8_2_) >> 4;
      uVar86 = (ushort)(auVar135._10_2_ + sVar94 + auVar157._10_2_) >> 4;
      uVar87 = (ushort)(auVar135._12_2_ + sVar90 + auVar157._12_2_) >> 4;
      uVar88 = (ushort)(auVar135._14_2_ + sVar94 + auVar157._14_2_) >> 4;
      *(ulong *)(pu1_dst + lVar13 * 2) =
           CONCAT17((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                    CONCAT16((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87),
                             CONCAT15((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                      (0xff < uVar86),
                                      CONCAT14((uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 -
                                               (0xff < uVar85),
                                               CONCAT13((uVar84 != 0) * (uVar84 < 0x100) *
                                                        (char)uVar84 - (0xff < uVar84),
                                                        CONCAT12((uVar83 != 0) * (uVar83 < 0x100) *
                                                                 (char)uVar83 - (0xff < uVar83),
                                                                 CONCAT11((uVar82 != 0) *
                                                                          (uVar82 < 0x100) *
                                                                          (char)uVar82 -
                                                                          (0xff < uVar82),
                                                                          (uVar77 != 0) *
                                                                          (uVar77 < 0x100) *
                                                                          (char)uVar77 -
                                                                          (0xff < uVar77))))))));
      uVar77 = (ushort)(auVar22._0_2_ + sVar90 + auVar115._0_2_) >> 4;
      uVar82 = (ushort)(auVar22._2_2_ + sVar94 + auVar115._2_2_) >> 4;
      uVar83 = (ushort)(auVar22._4_2_ + sVar90 + auVar115._4_2_) >> 4;
      uVar84 = (ushort)(auVar22._6_2_ + sVar94 + auVar115._6_2_) >> 4;
      uVar85 = (ushort)(auVar22._8_2_ + sVar90 + auVar115._8_2_) >> 4;
      uVar86 = (ushort)(auVar22._10_2_ + sVar94 + auVar115._10_2_) >> 4;
      uVar87 = (ushort)(auVar22._12_2_ + sVar90 + auVar115._12_2_) >> 4;
      uVar88 = (ushort)(auVar22._14_2_ + sVar94 + auVar115._14_2_) >> 4;
      *(ulong *)(pu1_dst + lVar13 * 3) =
           CONCAT17((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                    CONCAT16((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87),
                             CONCAT15((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                      (0xff < uVar86),
                                      CONCAT14((uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 -
                                               (0xff < uVar85),
                                               CONCAT13((uVar84 != 0) * (uVar84 < 0x100) *
                                                        (char)uVar84 - (0xff < uVar84),
                                                        CONCAT12((uVar83 != 0) * (uVar83 < 0x100) *
                                                                 (char)uVar83 - (0xff < uVar83),
                                                                 CONCAT11((uVar82 != 0) *
                                                                          (uVar82 < 0x100) *
                                                                          (char)uVar82 -
                                                                          (0xff < uVar82),
                                                                          (uVar77 != 0) *
                                                                          (uVar77 < 0x100) *
                                                                          (char)uVar77 -
                                                                          (0xff < uVar77))))))));
      auVar34._0_2_ = sVar63 + -0x400;
      auVar34._2_2_ = sVar68 + -0x400;
      auVar34._4_2_ = sVar69 + -0x400;
      auVar34._6_2_ = sVar70 + -0x400;
      auVar34._8_2_ = sVar71 + -0x400;
      auVar34._10_2_ = sVar72 + -0x400;
      auVar34._12_2_ = sVar73 + -0x400;
      auVar34._14_2_ = sVar74 + -0x400;
      auVar32._0_2_ = sVar96 + 0x400;
      auVar32._2_2_ = sVar98 + 0x400;
      auVar32._4_2_ = sVar25 + 0x400;
      auVar32._6_2_ = sVar26 + 0x400;
      auVar32._8_2_ = sVar27 + 0x400;
      auVar32._10_2_ = sVar28 + 0x400;
      auVar32._12_2_ = sVar29 + 0x400;
      auVar32._14_2_ = sVar30 + 0x400;
      pu1_dst = pu1_dst + lVar13 * 4;
      uVar16 = uVar16 - 4;
      lVar19 = lVar19 + -4;
    } while (lVar19 == 0);
  }
  else if (0 < nt) {
    uVar16 = nt - 1;
    auVar22 = pshuflw(ZEXT116(bVar3),ZEXT116(bVar3),0);
    auVar31 = pshuflw(ZEXT416(uVar16),ZEXT416(uVar16),0);
    uVar20 = 0;
    auVar135 = pmovsxbw(in_XMM2,0x807060504030201);
    auVar148 = pmovsxbw(in_XMM3,0xfcfcfcfcfcfcfcfc);
    auVar79 = pmovsxbw(in_XMM4,0x404040404040404);
    do {
      auVar124 = pshuflw(ZEXT116(pu1_ref[~uVar20 + (ulong)uVar4]),
                         ZEXT116(pu1_ref[~uVar20 + (ulong)uVar4]),0);
      iVar18 = (int)uVar20;
      uVar20 = uVar20 + 1;
      auVar144 = ZEXT416(uVar16 - iVar18);
      auVar144 = pshuflw(auVar144,auVar144,0);
      auVar157 = ZEXT416((int)uVar20 * (uint)bVar2 + nt);
      auVar157 = pshuflw(auVar157,auVar157,0);
      uVar15 = 0;
      auVar81 = auVar135;
      sVar90 = auVar31._0_2_;
      sVar94 = auVar31._2_2_ + -1;
      sVar96 = auVar31._0_2_ + -2;
      sVar98 = auVar31._2_2_ + -3;
      do {
        auVar105 = pmovzxbw(auVar115,*(undefined8 *)(pu1_ref + uVar15 + (ulong)uVar4 + 1));
        sVar25 = auVar144._0_2_;
        auVar115._0_2_ = auVar105._0_2_ * sVar25;
        sVar26 = auVar144._2_2_;
        auVar115._2_2_ = auVar105._2_2_ * sVar26;
        auVar115._4_2_ = auVar105._4_2_ * sVar25;
        auVar115._6_2_ = auVar105._6_2_ * sVar26;
        auVar115._8_2_ = auVar105._8_2_ * sVar25;
        auVar115._10_2_ = auVar105._10_2_ * sVar26;
        auVar115._12_2_ = auVar105._12_2_ * sVar25;
        auVar115._14_2_ = auVar105._14_2_ * sVar26;
        sVar25 = auVar81._2_2_;
        sVar26 = auVar81._4_2_;
        sVar27 = auVar81._6_2_;
        sVar28 = auVar81._8_2_;
        sVar29 = auVar81._10_2_;
        sVar30 = auVar81._12_2_;
        sVar63 = auVar81._14_2_;
        uVar77 = (ushort)(sVar90 * auVar124._0_2_ + auVar157._0_2_ + auVar81._0_2_ * auVar22._0_2_ +
                         auVar115._0_2_) >> 3;
        uVar82 = (ushort)(sVar94 * auVar124._2_2_ + auVar157._2_2_ + sVar25 * auVar22._2_2_ +
                         auVar115._2_2_) >> 3;
        uVar83 = (ushort)(sVar96 * auVar124._0_2_ + auVar157._0_2_ + sVar26 * auVar22._0_2_ +
                         auVar115._4_2_) >> 3;
        uVar84 = (ushort)(sVar98 * auVar124._2_2_ + auVar157._2_2_ + sVar27 * auVar22._2_2_ +
                         auVar115._6_2_) >> 3;
        *(uint *)(pu1_dst + uVar15) =
             CONCAT13((uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84),
                      CONCAT12((uVar83 != 0) * (uVar83 < 0x100) * (char)uVar83 - (0xff < uVar83),
                               CONCAT11((uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 -
                                        (0xff < uVar82),
                                        (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 -
                                        (0xff < uVar77))));
        sVar90 = sVar90 + auVar148._0_2_;
        sVar94 = sVar94 + auVar148._2_2_;
        sVar96 = sVar96 + auVar148._4_2_;
        sVar98 = sVar98 + auVar148._6_2_;
        auVar81._0_2_ = auVar81._0_2_ + auVar79._0_2_;
        auVar81._2_2_ = sVar25 + auVar79._2_2_;
        auVar81._4_2_ = sVar26 + auVar79._4_2_;
        auVar81._6_2_ = sVar27 + auVar79._6_2_;
        auVar81._8_2_ = sVar28 + auVar79._8_2_;
        auVar81._10_2_ = sVar29 + auVar79._10_2_;
        auVar81._12_2_ = sVar30 + auVar79._12_2_;
        auVar81._14_2_ = sVar63 + auVar79._14_2_;
        uVar15 = uVar15 + 4;
      } while (uVar15 < (uint)nt);
      pu1_dst = pu1_dst + dst_strd;
    } while (uVar20 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_planar_ssse3(UWORD8 *pu1_ref,
                                        WORD32 src_strd,
                                        UWORD8 *pu1_dst,
                                        WORD32 dst_strd,
                                        WORD32 nt,
                                        WORD32 mode)
{


    WORD32 row, col;
    WORD32 two_nt, three_nt;
    UWORD16 temp;

    __m128i pu1_ref_16x8b, const_temp_4x32b, const_temp1_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i col_8x16b, const_temp5_4x32b, const_temp6_4x32b, zero_8x16b, const_temp7_4x32b, const_temp8_4x32b;
    __m128i nt_row_16x8b, nt_row1_16x8b, nt_row2_16x8b, nt_row3_16x8b; //nt-1-row
    __m128i row_16x8b, row1_16x8b, row2_16x8b, row3_16x8b; //row+1
    UNUSED(src_strd);
    UNUSED(mode);

    two_nt = 2 * nt;
    three_nt = 3 * nt;

    /* Planar filtering */
    temp = pu1_ref[nt - 1];
    temp = (temp << 8) | ((UWORD16)pu1_ref[three_nt + 1]);
    /* setting vallues in  registera*/
    pu1_ref_16x8b  = _mm_set1_epi16(temp);
    const_temp6_4x32b = _mm_set1_epi16(nt);



    if(nt == 32) /* for nt multiple of 8*/
    {


        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        const_temp8_4x32b = _mm_set1_epi16(0x0008);
        //(nt-1-y) (nt-1-x) ; x= 0..15 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x1f18, 0x1f19, 0x1f1a, 0x1f1b, 0x1f1c, 0x1f1d, 0x1f1e, 0x1f1f);
        //(y+1) (x+1) ; x= 0..15 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 1)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b, src_temp1_8x16b;


            res_temp1_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);

            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp8_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp8_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp8_4x32b);
            row2_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp8_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row2_16x8b, const_temp8_4x32b);
            row3_16x8b    = _mm_add_epi16(row2_16x8b,    const_temp8_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 17));

            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp1_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp1_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 6); //log2(32)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 6);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 6);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 6);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, res_temp1_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp2_8x16b, res_temp3_8x16b);


            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd) + 16), res_temp1_8x16b);


            nt_row_16x8b = _mm_sub_epi16(nt_row_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row_16x8b,    const_temp1_4x32b);
        }
    }
    else if(nt == 16) /* for nt multiple of 8*/
    {

        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        const_temp8_4x32b = _mm_set1_epi16(0x0008);
        //(nt-1-y) (nt-1-x) ; x= 0..15 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x0f08, 0x0f09, 0x0f0a, 0x0f0b, 0x0f0c, 0x0f0d, 0x0f0e, 0x0f0f);
        //(y+1) (x+1) ; x= 0..15 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 2)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b;


            res_temp1_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);
            res_temp2_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 2 - row]);


            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp1_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp1_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp8_4x32b);
            row2_16x8b    = _mm_add_epi16(row_16x8b,     const_temp8_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp8_4x32b);
            row3_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp8_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));


            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpacklo_epi8(res_temp2_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpackhi_epi8(res_temp2_8x16b, src_temp_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 5); //log2(16)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 5);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 5);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 5);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, res_temp2_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, res_temp3_8x16b);

            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), res_temp1_8x16b);

            nt_row_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp1_4x32b);
        }
    }
    else if(nt == 8)
    {


        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        zero_8x16b = _mm_set1_epi32(0);

        //(nt-1-y) (nt-1-x) ; x= 0..7 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x0700, 0x0701, 0x0702, 0x0703, 0x0704, 0x0705, 0x0706, 0x0707);
        //(y+1) (x+1) ; x= 0..7 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 4)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b;


            res_temp4_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);
            res_temp5_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 2 - row]);
            res_temp6_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 3 - row]);
            res_temp7_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 4 - row]);

            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp1_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp1_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp1_4x32b);
            row2_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp1_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row2_16x8b, const_temp1_4x32b);
            row3_16x8b    = _mm_add_epi16(row2_16x8b,    const_temp1_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp4_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpacklo_epi8(res_temp5_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpacklo_epi8(res_temp6_8x16b, src_temp_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpacklo_epi8(res_temp7_8x16b, src_temp_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 4); //log2(16)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 4);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 4);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 4);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, zero_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);
            res_temp2_8x16b = _mm_packus_epi16(res_temp2_8x16b, zero_8x16b);
            res_temp3_8x16b = _mm_packus_epi16(res_temp3_8x16b, zero_8x16b);

            _mm_storel_epi64((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), res_temp1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), res_temp2_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), res_temp3_8x16b);

            nt_row_16x8b = _mm_sub_epi16(nt_row3_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row3_16x8b,    const_temp1_4x32b);
        }
    }
    else
    {

        /* for nt multiple of 4*/
        const_temp7_4x32b = _mm_set1_epi16(4);
        const_temp4_4x32b = _mm_set1_epi16(nt - 1);
        const_temp_4x32b  = _mm_set1_epi16(pu1_ref[three_nt + 1]);
        const_temp1_4x32b = _mm_set1_epi16(pu1_ref[nt - 1]);
        zero_8x16b = _mm_set1_epi32(0);

        for(row = 0; row < nt; row++)
        {
            __m128i res_temp_8x16b, row_8x16b, res_temp1_8x16b, res_temp2_8x16b;
            __m128i res_temp3_8x16b;

            const_temp2_4x32b  = _mm_set1_epi16(pu1_ref[two_nt - 1 - row]);
            const_temp3_4x32b  = _mm_set1_epi16((row + 1));


            row_8x16b = _mm_set1_epi16((nt - 1 - row));

            const_temp5_4x32b = _mm_set_epi16(7, 6, 5, 4, 3, 2, 1, 0);
            col_8x16b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);

            const_temp5_4x32b = _mm_sub_epi16(const_temp4_4x32b, const_temp5_4x32b);

            /*(row + 1) * pu1_ref[nt - 1]*/
            res_temp_8x16b  = _mm_mullo_epi16(const_temp3_4x32b,  const_temp1_4x32b);

            /*(row + 1) * pu1_ref[nt - 1] + nt)*/
            res_temp_8x16b = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);

            for(col = 0; col < nt; col += 4)
            {
                __m128i src_temp_8x16b;
                int temp1;

                /* loding 8bit 16 pixles*/
                src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + col));

                src_temp_8x16b =  _mm_unpacklo_epi8(src_temp_8x16b, zero_8x16b); /* row=0*/

                /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] */
                res_temp1_8x16b  = _mm_mullo_epi16(src_temp_8x16b,  row_8x16b);

                /*(col + 1) * pu1_ref[three_nt + 1]*/
                res_temp2_8x16b  = _mm_mullo_epi16(const_temp_4x32b,  col_8x16b);

                /*(nt - 1 - col)* pu1_ref[two_nt - 1 - row]*/
                res_temp3_8x16b  = _mm_mullo_epi16(const_temp2_4x32b,  const_temp5_4x32b);

                res_temp1_8x16b = _mm_add_epi16(res_temp_8x16b, res_temp1_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp3_8x16b);

                res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 3); //log2(16)+1
                res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);

                temp1 = _mm_cvtsi128_si32(res_temp1_8x16b);

                *(WORD32 *)(&pu1_dst[(row * dst_strd) + col]) = temp1;

                const_temp5_4x32b = _mm_sub_epi16(const_temp5_4x32b, const_temp7_4x32b);
                col_8x16b = _mm_add_epi16(col_8x16b, const_temp7_4x32b);
            } /* inner loop ends here */
        }
    }


}